

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ReportError
          (ParserImpl *this,int line,int col,string *message)

{
  ErrorCollector *pEVar1;
  LogMessage *pLVar2;
  LogFinisher local_61;
  LogMessage local_60;
  
  this->had_errors_ = true;
  pEVar1 = this->error_collector_;
  if (pEVar1 != (ErrorCollector *)0x0) {
    (*pEVar1->_vptr_ErrorCollector[2])(pEVar1,(ulong)(uint)line,(ulong)(uint)col,message);
    return;
  }
  if (line < 0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/text_format.cc"
               ,0x139);
    pLVar2 = internal::LogMessage::operator<<(&local_60,"Error parsing text-format ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,*(string **)(this->root_message_type_ + 8));
    pLVar2 = internal::LogMessage::operator<<(pLVar2,": ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,message);
    internal::LogFinisher::operator=(&local_61,pLVar2);
  }
  else {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/text_format.cc"
               ,0x135);
    pLVar2 = internal::LogMessage::operator<<(&local_60,"Error parsing text-format ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,*(string **)(this->root_message_type_ + 8));
    pLVar2 = internal::LogMessage::operator<<(pLVar2,": ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,line + 1);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,":");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,col + 1);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,": ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,message);
    internal::LogFinisher::operator=(&local_61,pLVar2);
  }
  internal::LogMessage::~LogMessage(&local_60);
  return;
}

Assistant:

void ReportError(int line, int col, const std::string& message) {
    had_errors_ = true;
    if (error_collector_ == nullptr) {
      if (line >= 0) {
        GOOGLE_LOG(ERROR) << "Error parsing text-format "
                   << root_message_type_->full_name() << ": " << (line + 1)
                   << ":" << (col + 1) << ": " << message;
      } else {
        GOOGLE_LOG(ERROR) << "Error parsing text-format "
                   << root_message_type_->full_name() << ": " << message;
      }
    } else {
      error_collector_->AddError(line, col, message);
    }
  }